

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_modern_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  uint32_t local_184;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  char *local_30;
  uint32_t local_28;
  bool local_21;
  SPIRType *pSStack_20;
  bool is_coherent;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_20 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  if (pSStack_20->basetype - Image < 2) {
    local_21 = false;
    if ((pSStack_20->basetype == Image) && ((pSStack_20->image).sampled == 2)) {
      local_28 = (type->super_IVariant).self.id;
      local_21 = Compiler::has_decoration((Compiler *)this,(ID)local_28,DecorationCoherent);
    }
    pSVar1 = pSStack_20;
    local_30 = "";
    if (local_21 != false) {
      local_30 = "globallycoherent ";
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    image_type_hlsl_modern_abi_cxx11_(&local_50,this,pSVar1,uVar3);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_70,this,(ulong)uVar3,1);
    pSVar1 = pSStack_20;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
              (&local_a0,this,pSVar1,(ulong)uVar3);
    to_resource_binding_abi_cxx11_(&local_c0,this,(SPIRVariable *)type);
    CompilerGLSL::
    statement<char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_30,&local_50,(char (*) [2])0x4921b2,&local_70,
               &local_a0,&local_c0,(char (*) [2])0x4af37c);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    pSVar1 = pSStack_20;
    if ((pSStack_20->basetype == SampledImage) && ((pSStack_20->image).dim != DimBuffer)) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      bVar2 = Compiler::is_depth_image((Compiler *)this,pSVar1,uVar3);
      if (bVar2) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        to_sampler_expression_abi_cxx11_(&local_e0,this,uVar3);
        pSVar1 = pSStack_20;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                  (&local_100,this,pSVar1,(ulong)uVar3);
        to_resource_binding_sampler_abi_cxx11_(&local_120,this,(SPIRVariable *)type);
        CompilerGLSL::
        statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_e0,
                   &local_100,&local_120,(char (*) [2])0x4af37c);
        ::std::__cxx11::string::~string((string *)&local_120);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_e0);
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        to_sampler_expression_abi_cxx11_(&local_140,this,uVar3);
        pSVar1 = pSStack_20;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                  (&local_160,this,pSVar1,(ulong)uVar3);
        to_resource_binding_sampler_abi_cxx11_(&local_180,this,(SPIRVariable *)type);
        CompilerGLSL::
        statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_140,&local_160,
                   &local_180,(char (*) [2])0x4af37c);
        ::std::__cxx11::string::~string((string *)&local_180);
        ::std::__cxx11::string::~string((string *)&local_160);
        ::std::__cxx11::string::~string((string *)&local_140);
      }
    }
  }
  else if (pSStack_20->basetype == Sampler) {
    local_184 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    sVar4 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids,&local_184);
    if (sVar4 == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_208,this,(ulong)uVar3,1)
      ;
      pSVar1 = pSStack_20;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                (&local_228,this,pSVar1,(ulong)uVar3);
      to_resource_binding_abi_cxx11_(&local_248,this,(SPIRVariable *)type);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_208,&local_228,
                 &local_248,(char (*) [2])0x4af37c);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_1a8,this,(ulong)uVar3,1)
      ;
      pSVar1 = pSStack_20;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                (&local_1c8,this,pSVar1,(ulong)uVar3);
      to_resource_binding_abi_cxx11_(&local_1e8,this,(SPIRVariable *)type);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_1a8,
                 &local_1c8,&local_1e8,(char (*) [2])0x4af37c);
      ::std::__cxx11::string::~string((string *)&local_1e8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::~string((string *)&local_1a8);
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&local_268,this,type);
    to_resource_binding_abi_cxx11_(&local_288,this,(SPIRVariable *)type);
    CompilerGLSL::statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_268,&local_288,(char (*) [2])0x4af37c);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_268);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_modern_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	{
		bool is_coherent = false;
		if (type.basetype == SPIRType::Image && type.image.sampled == 2)
			is_coherent = has_decoration(var.self, DecorationCoherent);

		statement(is_coherent ? "globallycoherent " : "", image_type_hlsl_modern(type, var.self), " ",
		          to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");

		if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		{
			// For combined image samplers, also emit a combined image sampler.
			if (is_depth_image(type, var.self))
				statement("SamplerComparisonState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
			else
				statement("SamplerState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
		}
		break;
	}

	case SPIRType::Sampler:
		if (comparison_ids.count(var.self))
			statement("SamplerComparisonState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var),
			          ";");
		else
			statement("SamplerState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");
		break;

	default:
		statement(variable_decl(var), to_resource_binding(var), ";");
		break;
	}
}